

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

UniValue * JSONRPCPSBTError(UniValue *__return_storage_ptr__,PSBTError err)

{
  int code;
  long in_FS_OFFSET;
  bilingual_str local_60;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  code = -8;
  if (err != UNSUPPORTED) {
    code = (uint)(err == SIGHASH_MISMATCH) * 3 + -0x19;
  }
  common::PSBTErrorString(&local_60,err);
  JSONRPCError(__return_storage_ptr__,code,&local_60.original);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.translated._M_dataplus._M_p != &local_60.translated.field_2) {
    operator_delete(local_60.translated._M_dataplus._M_p,
                    local_60.translated.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.original._M_dataplus._M_p != &local_60.original.field_2) {
    operator_delete(local_60.original._M_dataplus._M_p,
                    local_60.original.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue JSONRPCPSBTError(PSBTError err)
{
    return JSONRPCError(RPCErrorFromPSBTError(err), PSBTErrorString(err).original);
}